

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O1

rrb<int,_false,_6> *
immutable::rrb_details::rrb_tail_push<int,false,6>
          (ref<immutable::rrb<int,_false,_6>_> *in,int element)

{
  uint32_t *puVar1;
  size_t __size;
  uint32_t uVar2;
  rrb<int,_false,_6> *prVar3;
  tree_node<int,_false> *ptVar4;
  leaf_node<int,_false> *plVar5;
  int *piVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  undefined4 uVar9;
  rrb<int,_false,_6> *prVar10;
  leaf_node<int,_false> *__s;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ref<immutable::rrb_details::leaf_node<int,_false>_> local_38;
  
  prVar3 = in->ptr;
  prVar10 = (rrb<int,_false,_6> *)malloc(0x28);
  uVar2 = prVar3->cnt;
  uVar7 = prVar3->shift;
  uVar8 = prVar3->tail_len;
  uVar9 = *(undefined4 *)&prVar3->field_0xc;
  ptVar4 = (prVar3->root).ptr;
  (prVar10->tail).ptr = (prVar3->tail).ptr;
  (prVar10->root).ptr = ptVar4;
  prVar10->cnt = uVar2;
  prVar10->shift = uVar7;
  prVar10->tail_len = uVar8;
  *(undefined4 *)&prVar10->field_0xc = uVar9;
  uVar9 = *(undefined4 *)&prVar3->field_0x24;
  prVar10->_ref_count = prVar3->_ref_count;
  *(undefined4 *)&prVar10->field_0x24 = uVar9;
  ptVar4 = (prVar10->root).ptr;
  if (ptVar4 != (tree_node<int,_false> *)0x0) {
    puVar1 = &ptVar4->_ref_count;
    *puVar1 = *puVar1 + 1;
  }
  plVar5 = (prVar10->tail).ptr;
  if (plVar5 != (leaf_node<int,_false> *)0x0) {
    puVar1 = &plVar5->_ref_count;
    *puVar1 = *puVar1 + 1;
  }
  if (prVar3 != (rrb<int,_false,_6> *)0x0) {
    plVar5 = (prVar3->tail).ptr;
    uVar12 = plVar5->len + 1;
    __size = (ulong)uVar12 * 4 + 0x18;
    __s = (leaf_node<int,_false> *)malloc(__size);
    memset(__s,0,__size);
    __s->len = uVar12;
    __s->type = LEAF_NODE;
    __s->child = (int *)(__s + 1);
    __s->guid = 0;
    uVar11 = (ulong)plVar5->len;
    if (uVar11 != 0) {
      piVar6 = plVar5->child;
      uVar13 = 0;
      do {
        (&__s[1].type)[uVar13] = piVar6[uVar13];
        uVar13 = uVar13 + 1;
      } while (uVar11 != uVar13);
    }
    (&__s[1].type)[uVar11] = LEAF_NODE;
    uVar12 = prVar10->tail_len;
    (&__s[1].type)[uVar12] = element;
    prVar10->cnt = prVar10->cnt + 1;
    prVar10->tail_len = uVar12 + 1;
    __s->_ref_count = 1;
    local_38.ptr = __s;
    ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=(&prVar10->tail,&local_38);
    if ((local_38.ptr != (leaf_node<int,_false> *)0x0) &&
       (uVar2 = (local_38.ptr)->_ref_count, (local_38.ptr)->_ref_count = uVar2 - 1, uVar2 == 1)) {
      free(local_38.ptr);
    }
    return prVar10;
  }
  __assert_fail("ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x71a,
                "T *immutable::ref<immutable::rrb<int, false, 6>>::operator->() const [T = immutable::rrb<int, false, 6>]"
               );
}

Assistant:

inline rrb<T, atomic_ref_counting, N>* rrb_tail_push(const ref<rrb<T, atomic_ref_counting, N>>& in, T element)
      {
      rrb<T, atomic_ref_counting, N>* new_rrb = rrb_head_clone(in.ptr);
      leaf_node<T, atomic_ref_counting>* new_tail = leaf_node_inc(in->tail.ptr);
      new_tail->child[new_rrb->tail_len] = std::move(element);
      new_rrb->cnt++;
      new_rrb->tail_len++;
      new_rrb->tail = new_tail;
      return new_rrb;
      }